

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          size_t size,align_spec *spec,inf_or_nan_writer f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  char cVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  wchar_t __tmp;
  size_t size_1;
  int *piVar14;
  basic_buffer<wchar_t> *c;
  int iVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  pcVar11 = f.str;
  cVar8 = f.sign;
  uVar13 = (ulong)spec->width_;
  puVar2 = *(undefined8 **)this;
  lVar9 = puVar2[2];
  uVar12 = uVar13 - size;
  if (uVar13 < size || uVar12 == 0) {
    uVar12 = size + lVar9;
    if ((ulong)puVar2[3] < uVar12) {
      (**(code **)*puVar2)(puVar2,uVar12);
    }
    puVar2[2] = uVar12;
    piVar14 = (int *)(lVar9 * 4 + puVar2[1]);
    if (cVar8 != '\0') {
      *piVar14 = (int)cVar8;
      piVar14 = piVar14 + 1;
    }
    uVar12 = 4;
    lVar9 = 0;
    do {
      piVar14[lVar9] = (int)pcVar11[lVar9];
      uVar12 = uVar12 - 1;
      lVar9 = lVar9 + 1;
    } while (1 < uVar12);
  }
  else {
    if ((ulong)puVar2[3] < lVar9 + uVar13) {
      (**(code **)*puVar2)(puVar2);
    }
    puVar2[2] = lVar9 + uVar13;
    auVar6 = _DAT_00137fc0;
    auVar5 = _DAT_00137fb0;
    auVar4 = _DAT_00137010;
    lVar3 = puVar2[1];
    piVar14 = (int *)(lVar3 + lVar9 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar10 = uVar12 >> 1;
      if (1 < uVar12) {
        piVar14 = piVar14 + uVar10;
        uVar12 = uVar10 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar25._8_4_ = (int)uVar12;
        auVar25._0_8_ = uVar12;
        auVar25._12_4_ = (int)(uVar12 >> 0x20);
        lVar3 = lVar3 + lVar9 * 4;
        lVar9 = 0;
        auVar25 = auVar25 ^ _DAT_00137010;
        do {
          auVar22._8_4_ = (int)lVar9;
          auVar22._0_8_ = lVar9;
          auVar22._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar26 = (auVar22 | auVar6) ^ auVar4;
          iVar20 = auVar25._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar20 && auVar25._0_4_ < auVar26._0_4_ ||
                      iVar20 < auVar26._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar9 * 4) = wVar1;
          }
          if ((auVar26._12_4_ != auVar25._12_4_ || auVar26._8_4_ <= auVar25._8_4_) &&
              auVar26._12_4_ <= auVar25._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar9 * 4) = wVar1;
          }
          auVar22 = (auVar22 | auVar5) ^ auVar4;
          iVar27 = auVar22._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar22._0_4_ <= auVar25._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar9 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar9 * 4) = wVar1;
          }
          lVar9 = lVar9 + 4;
        } while ((uVar12 - ((uint)(uVar10 + 0x3fffffffffffffff) & 3)) + 4 != lVar9);
      }
      if (cVar8 != '\0') {
        *piVar14 = (int)cVar8;
        piVar14 = piVar14 + 1;
      }
      uVar12 = 4;
      do {
        piVar7 = piVar14;
        *piVar7 = (int)*pcVar11;
        auVar6 = _DAT_00137fc0;
        auVar5 = _DAT_00137fb0;
        auVar4 = _DAT_00137010;
        pcVar11 = pcVar11 + 1;
        uVar12 = uVar12 - 1;
        piVar14 = piVar7 + 1;
      } while (1 < uVar12);
      if (uVar13 != size) {
        uVar13 = (uVar13 * 4 + (uVar10 + size) * -4) - 4;
        auVar26._8_4_ = (int)uVar13;
        auVar26._0_8_ = uVar13;
        auVar26._12_4_ = (int)(uVar13 >> 0x20);
        auVar17._0_8_ = uVar13 >> 2;
        auVar17._8_8_ = auVar26._8_8_ >> 2;
        uVar12 = 0;
        auVar17 = auVar17 ^ _DAT_00137010;
        do {
          auVar23._8_4_ = (int)uVar12;
          auVar23._0_8_ = uVar12;
          auVar23._12_4_ = (int)(uVar12 >> 0x20);
          auVar25 = (auVar23 | auVar6) ^ auVar4;
          iVar20 = auVar17._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar17._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            (piVar7 + 1)[uVar12] = wVar1;
          }
          if ((auVar25._12_4_ != auVar17._12_4_ || auVar25._8_4_ <= auVar17._8_4_) &&
              auVar25._12_4_ <= auVar17._12_4_) {
            piVar7[uVar12 + 2] = wVar1;
          }
          auVar25 = (auVar23 | auVar5) ^ auVar4;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar17._0_4_)) {
            piVar7[uVar12 + 3] = wVar1;
            piVar7[uVar12 + 4] = wVar1;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar13 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar13 != size) {
        piVar14 = piVar14 + uVar12;
        uVar13 = (uVar13 * 4 + size * -4) - 4;
        auVar15._8_4_ = (int)uVar13;
        auVar15._0_8_ = uVar13;
        auVar15._12_4_ = (int)(uVar13 >> 0x20);
        auVar16._0_8_ = uVar13 >> 2;
        auVar16._8_8_ = auVar15._8_8_ >> 2;
        lVar3 = lVar3 + lVar9 * 4;
        uVar12 = 0;
        auVar16 = auVar16 ^ _DAT_00137010;
        do {
          auVar21._8_4_ = (int)uVar12;
          auVar21._0_8_ = uVar12;
          auVar21._12_4_ = (int)(uVar12 >> 0x20);
          auVar25 = (auVar21 | auVar6) ^ auVar4;
          iVar20 = auVar16._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar16._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + uVar12 * 4) = wVar1;
          }
          if ((auVar25._12_4_ != auVar16._12_4_ || auVar25._8_4_ <= auVar16._8_4_) &&
              auVar25._12_4_ <= auVar16._12_4_) {
            *(wchar_t *)(lVar3 + 4 + uVar12 * 4) = wVar1;
          }
          auVar25 = (auVar21 | auVar5) ^ auVar4;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar16._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + uVar12 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + uVar12 * 4) = wVar1;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar13 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
      if (cVar8 != '\0') {
        *piVar14 = (int)cVar8;
        piVar14 = piVar14 + 1;
      }
      uVar12 = 4;
      lVar9 = 0;
      do {
        piVar14[lVar9] = (int)pcVar11[lVar9];
        uVar12 = uVar12 - 1;
        lVar9 = lVar9 + 1;
      } while (1 < uVar12);
    }
    else {
      if (cVar8 != '\0') {
        *piVar14 = (int)cVar8;
        piVar14 = piVar14 + 1;
      }
      uVar12 = 4;
      do {
        piVar7 = piVar14;
        *piVar7 = (int)*pcVar11;
        auVar6 = _DAT_00137fc0;
        auVar5 = _DAT_00137fb0;
        auVar4 = _DAT_00137010;
        pcVar11 = pcVar11 + 1;
        uVar12 = uVar12 - 1;
        piVar14 = piVar7 + 1;
      } while (1 < uVar12);
      if (uVar13 != size) {
        uVar13 = (uVar13 * 4 + size * -4) - 4;
        auVar18._8_4_ = (int)uVar13;
        auVar18._0_8_ = uVar13;
        auVar18._12_4_ = (int)(uVar13 >> 0x20);
        auVar19._0_8_ = uVar13 >> 2;
        auVar19._8_8_ = auVar18._8_8_ >> 2;
        uVar12 = 0;
        auVar19 = auVar19 ^ _DAT_00137010;
        do {
          auVar24._8_4_ = (int)uVar12;
          auVar24._0_8_ = uVar12;
          auVar24._12_4_ = (int)(uVar12 >> 0x20);
          auVar25 = (auVar24 | auVar6) ^ auVar4;
          iVar20 = auVar19._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar19._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            (piVar7 + 1)[uVar12] = wVar1;
          }
          if ((auVar25._12_4_ != auVar19._12_4_ || auVar25._8_4_ <= auVar19._8_4_) &&
              auVar25._12_4_ <= auVar19._12_4_) {
            piVar7[uVar12 + 2] = wVar1;
          }
          auVar25 = (auVar24 | auVar5) ^ auVar4;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar19._0_4_)) {
            piVar7[uVar12 + 3] = wVar1;
            piVar7[uVar12 + 4] = wVar1;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar13 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}